

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseContextBase.cpp
# Opt level: O2

void __thiscall
glslang::TParseContextBase::warn
          (TParseContextBase *this,TSourceLoc *loc,char *szReason,char *szToken,
          char *szExtraInfoFormat,...)

{
  va_list args;
  
  if (((this->super_TParseVersions).messages & EShMsgSuppressWarnings) == EShMsgDefault) {
    (*(this->super_TParseVersions)._vptr_TParseVersions[0x4c])();
  }
  return;
}

Assistant:

void C_DECL TParseContextBase::warn(const TSourceLoc& loc, const char* szReason, const char* szToken,
                                    const char* szExtraInfoFormat, ...)
{
    if (suppressWarnings())
        return;
    va_list args;
    va_start(args, szExtraInfoFormat);
    outputMessage(loc, szReason, szToken, szExtraInfoFormat, EPrefixWarning, args);
    va_end(args);
}